

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O3

int yaml_document_add_scalar
              (yaml_document_t *document,yaml_char_t *tag,yaml_char_t *value,int length,
              yaml_scalar_style_t style)

{
  yaml_node_t **top;
  int iVar1;
  size_t sVar2;
  yaml_char_t *__ptr;
  yaml_char_t *__dest;
  yaml_node_t *pyVar3;
  size_t length_00;
  int iVar4;
  char *start;
  
  if (document == (yaml_document_t *)0x0) {
    __assert_fail("document",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x4b7,
                  "int yaml_document_add_scalar(yaml_document_t *, yaml_char_t *, yaml_char_t *, int, yaml_scalar_style_t)"
                 );
  }
  if (value == (yaml_char_t *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x4b8,
                  "int yaml_document_add_scalar(yaml_document_t *, yaml_char_t *, yaml_char_t *, int, yaml_scalar_style_t)"
                 );
  }
  start = "tag:yaml.org,2002:str";
  if (tag != (yaml_char_t *)0x0) {
    start = (char *)tag;
  }
  sVar2 = strlen(start);
  iVar1 = yaml_check_utf8((yaml_char_t *)start,sVar2);
  iVar4 = 0;
  if (iVar1 == 0) {
    return 0;
  }
  __ptr = (yaml_char_t *)strdup(start);
  if (__ptr == (yaml_char_t *)0x0) {
    return 0;
  }
  if (length < 0) {
    sVar2 = strlen((char *)value);
    length = (int)sVar2;
  }
  length_00 = (size_t)length;
  iVar1 = yaml_check_utf8(value,length_00);
  if ((iVar1 == 0) ||
     (__dest = (yaml_char_t *)malloc((long)(int)(length + 1 + (uint)(length == -1))),
     __dest == (yaml_char_t *)0x0)) {
LAB_001ab2c2:
    free(__ptr);
  }
  else {
    memcpy(__dest,value,length_00);
    __dest[length_00] = '\0';
    pyVar3 = (document->nodes).top;
    if (pyVar3 == (document->nodes).end) {
      top = &(document->nodes).top;
      iVar1 = yaml_stack_extend((void **)document,top,&(document->nodes).end);
      if (iVar1 == 0) {
        free(__ptr);
        __ptr = __dest;
        goto LAB_001ab2c2;
      }
      pyVar3 = *top;
    }
    (document->nodes).top = pyVar3 + 1;
    *(undefined8 *)pyVar3 = 1;
    pyVar3->tag = __ptr;
    (pyVar3->data).scalar.value = __dest;
    (pyVar3->data).scalar.length = length_00;
    (pyVar3->data).scalar.style = style;
    *(undefined8 *)((long)&(pyVar3->data).sequence.items.top + 4) = 0;
    *(undefined8 *)((long)&pyVar3->data + 0x1c) = 0;
    *(undefined8 *)((long)&(pyVar3->start_mark).index + 4) = 0;
    *(undefined8 *)((long)&(pyVar3->start_mark).line + 4) = 0;
    *(undefined8 *)((long)&(pyVar3->start_mark).column + 4) = 0;
    *(undefined8 *)((long)&(pyVar3->end_mark).index + 4) = 0;
    (pyVar3->end_mark).line = 0;
    (pyVar3->end_mark).column = 0;
    iVar4 = (int)((ulong)((long)(document->nodes).top - (long)(document->nodes).start) >> 5) *
            -0x55555555;
  }
  return iVar4;
}

Assistant:

YAML_DECLARE(int)
yaml_document_add_scalar(yaml_document_t *document,
        yaml_char_t *tag, yaml_char_t *value, int length,
        yaml_scalar_style_t style)
{
    struct {
        yaml_error_type_t error;
    } context;
    yaml_mark_t mark = { 0, 0, 0 };
    yaml_char_t *tag_copy = NULL;
    yaml_char_t *value_copy = NULL;
    yaml_node_t node;

    assert(document);   /* Non-NULL document object is expected. */
    assert(value);      /* Non-NULL value is expected. */

    if (!tag) {
        tag = (yaml_char_t *)YAML_DEFAULT_SCALAR_TAG;
    }

    if (!yaml_check_utf8(tag, strlen((char *)tag))) goto error;
    tag_copy = yaml_strdup(tag);
    if (!tag_copy) goto error;

    if (length < 0) {
        length = strlen((char *)value);
    }

    if (!yaml_check_utf8(value, length)) goto error;
    value_copy = YAML_MALLOC(length+1);
    if (!value_copy) goto error;
    memcpy(value_copy, value, length);
    value_copy[length] = '\0';

    SCALAR_NODE_INIT(node, tag_copy, value_copy, length, style, mark, mark);
    if (!PUSH(&context, document->nodes, node)) goto error;

    return document->nodes.top - document->nodes.start;

error:
    yaml_free(tag_copy);
    yaml_free(value_copy);

    return 0;
}